

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveZeros_naive_matches_template_::run
          (Test_bitileave_ileaveZeros_naive_matches_template_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  SourceLocation loc_08;
  SourceLocation loc_09;
  SourceLocation loc_10;
  SourceLocation loc_11;
  SourceLocation loc_12;
  SourceLocation loc_13;
  SourceLocation loc_14;
  SourceLocation loc_15;
  SourceLocation loc_16;
  SourceLocation loc_17;
  result_type_conflict input;
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  string_view msg_05;
  string_view msg_06;
  string_view msg_07;
  string_view msg_08;
  string_view msg_09;
  string_view msg_10;
  string_view msg_11;
  string_view msg_12;
  string_view msg_13;
  string_view msg_14;
  string_view msg_15;
  string_view msg_16;
  string_view msg_17;
  uint64_t local_1658;
  uint64_t local_1650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15e8;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_15c8;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_15a8;
  uniform_int_distribution<unsigned_int> distr;
  mt19937 rng;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rng,0x3039);
  distr._M_param._M_a = 0;
  distr._M_param._M_b = 0xffffffff;
  lVar3 = 0x2000;
  while( true ) {
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) {
      return;
    }
    input = std::uniform_int_distribution<unsigned_int>::operator()(&distr,&rng);
    uVar1 = detail::ileaveZeros_shift<1u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,1);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<1>(input) == detail::ileaveZeros_naive(input, 1) (with \"ileaveZeros_const<1>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 1)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_12.function = "run";
      loc_12.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_12.line = 0x90;
      msg_12._M_str = local_1648._M_dataplus._M_p;
      msg_12._M_len = local_1648._M_string_length;
      assertFail(msg_12,loc_12);
    }
    uVar1 = detail::ileaveZeros_shift<2u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,2);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<2>(input) == detail::ileaveZeros_naive(input, 2) (with \"ileaveZeros_const<2>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 2)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_10.function = "run";
      loc_10.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_10.line = 0x91;
      msg_10._M_str = local_1648._M_dataplus._M_p;
      msg_10._M_len = local_1648._M_string_length;
      assertFail(msg_10,loc_10);
    }
    uVar1 = detail::ileaveZeros_shift<3u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,3);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<3>(input) == detail::ileaveZeros_naive(input, 3) (with \"ileaveZeros_const<3>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 3)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_08.function = "run";
      loc_08.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_08.line = 0x92;
      msg_08._M_str = local_1648._M_dataplus._M_p;
      msg_08._M_len = local_1648._M_string_length;
      assertFail(msg_08,loc_08);
    }
    uVar1 = detail::ileaveZeros_shift<4u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,4);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<4>(input) == detail::ileaveZeros_naive(input, 4) (with \"ileaveZeros_const<4>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 4)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_06.function = "run";
      loc_06.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_06.line = 0x93;
      msg_06._M_str = local_1648._M_dataplus._M_p;
      msg_06._M_len = local_1648._M_string_length;
      assertFail(msg_06,loc_06);
    }
    uVar1 = detail::ileaveZeros_shift<5u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,5);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<5>(input) == detail::ileaveZeros_naive(input, 5) (with \"ileaveZeros_const<5>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 5)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_04.function = "run";
      loc_04.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_04.line = 0x94;
      msg_04._M_str = local_1648._M_dataplus._M_p;
      msg_04._M_len = local_1648._M_string_length;
      assertFail(msg_04,loc_04);
    }
    uVar1 = detail::ileaveZeros_shift<6u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,6);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<6>(input) == detail::ileaveZeros_naive(input, 6) (with \"ileaveZeros_const<6>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 6)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_02.function = "run";
      loc_02.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_02.line = 0x95;
      msg_02._M_str = local_1648._M_dataplus._M_p;
      msg_02._M_len = local_1648._M_string_length;
      assertFail(msg_02,loc_02);
    }
    uVar1 = detail::ileaveZeros_shift<7u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,7);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<7>(input) == detail::ileaveZeros_naive(input, 7) (with \"ileaveZeros_const<7>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 7)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_00.function = "run";
      loc_00.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_00.line = 0x96;
      msg_00._M_str = local_1648._M_dataplus._M_p;
      msg_00._M_len = local_1648._M_string_length;
      assertFail(msg_00,loc_00);
    }
    uVar1 = detail::ileaveZeros_shift<8u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,8);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<8>(input) == detail::ileaveZeros_naive(input, 8) (with \"ileaveZeros_const<8>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 8)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_15.function = "run";
      loc_15.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_15.line = 0x97;
      msg_15._M_str = local_1648._M_dataplus._M_p;
      msg_15._M_len = local_1648._M_string_length;
      assertFail(msg_15,loc_15);
    }
    uVar1 = detail::ileaveZeros_shift<9u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,9);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<9>(input) == detail::ileaveZeros_naive(input, 9) (with \"ileaveZeros_const<9>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 9)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_13.function = "run";
      loc_13.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_13.line = 0x98;
      msg_13._M_str = local_1648._M_dataplus._M_p;
      msg_13._M_len = local_1648._M_string_length;
      assertFail(msg_13,loc_13);
    }
    uVar1 = detail::ileaveZeros_shift<10u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,10);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<10>(input) == detail::ileaveZeros_naive(input, 10) (with \"ileaveZeros_const<10>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 10)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_11.function = "run";
      loc_11.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_11.line = 0x99;
      msg_11._M_str = local_1648._M_dataplus._M_p;
      msg_11._M_len = local_1648._M_string_length;
      assertFail(msg_11,loc_11);
    }
    uVar1 = detail::ileaveZeros_shift<11u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0xb);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<11>(input) == detail::ileaveZeros_naive(input, 11) (with \"ileaveZeros_const<11>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 11)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_09.function = "run";
      loc_09.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_09.line = 0x9a;
      msg_09._M_str = local_1648._M_dataplus._M_p;
      msg_09._M_len = local_1648._M_string_length;
      assertFail(msg_09,loc_09);
    }
    uVar1 = detail::ileaveZeros_shift<12u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0xc);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<12>(input) == detail::ileaveZeros_naive(input, 12) (with \"ileaveZeros_const<12>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 12)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_07.function = "run";
      loc_07.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_07.line = 0x9b;
      msg_07._M_str = local_1648._M_dataplus._M_p;
      msg_07._M_len = local_1648._M_string_length;
      assertFail(msg_07,loc_07);
    }
    uVar1 = detail::ileaveZeros_shift<13u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0xd);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<13>(input) == detail::ileaveZeros_naive(input, 13) (with \"ileaveZeros_const<13>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 13)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_05.function = "run";
      loc_05.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_05.line = 0x9c;
      msg_05._M_str = local_1648._M_dataplus._M_p;
      msg_05._M_len = local_1648._M_string_length;
      assertFail(msg_05,loc_05);
    }
    uVar1 = detail::ileaveZeros_shift<14u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0xe);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<14>(input) == detail::ileaveZeros_naive(input, 14) (with \"ileaveZeros_const<14>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 14)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_03.function = "run";
      loc_03.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_03.line = 0x9d;
      msg_03._M_str = local_1648._M_dataplus._M_p;
      msg_03._M_len = local_1648._M_string_length;
      assertFail(msg_03,loc_03);
    }
    uVar1 = detail::ileaveZeros_shift<15u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0xf);
    if (uVar1 != local_1658) break;
    uVar1 = detail::ileaveZeros_shift<16u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0x10);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<16>(input) == detail::ileaveZeros_naive(input, 16) (with \"ileaveZeros_const<16>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 16)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_16.function = "run";
      loc_16.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_16.line = 0x9f;
      msg_16._M_str = local_1648._M_dataplus._M_p;
      msg_16._M_len = local_1648._M_string_length;
      assertFail(msg_16,loc_16);
    }
    uVar1 = detail::ileaveZeros_shift<16u>(input);
    local_1650 = uVar1;
    local_1658 = detail::ileaveZeros_naive(input,0x10);
    if (uVar1 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<16>(input) == detail::ileaveZeros_naive(input, 16) (with \"ileaveZeros_const<16>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 16)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_14.function = "run";
      loc_14.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_14.line = 0xa0;
      msg_14._M_str = local_1648._M_dataplus._M_p;
      msg_14._M_len = local_1648._M_string_length;
      assertFail(msg_14,loc_14);
    }
    uVar2 = (ulong)input * 0x100000001 & 0x200000001;
    local_1650 = uVar2;
    local_1658 = detail::ileaveZeros_naive(input,0x20);
    if (uVar2 != local_1658) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<32>(input) == detail::ileaveZeros_naive(input, 32) (with \"ileaveZeros_const<32>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 32)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc_17.function = "run";
      loc_17.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_17.line = 0xa1;
      msg_17._M_str = local_1648._M_dataplus._M_p;
      msg_17._M_len = local_1648._M_string_length;
      assertFail(msg_17,loc_17);
    }
    local_1650 = (ulong)(input & 1);
    local_1658 = detail::ileaveZeros_naive(input,0x3f);
    if (local_1658 != (input & 1)) {
      stringify<unsigned_long>(&local_15a8,&local_1650);
      std::operator+(&local_1628,
                     "Comparison failed: ileaveZeros_const<63>(input) == detail::ileaveZeros_naive(input, 63) (with \"ileaveZeros_const<63>(input)\"="
                     ,&local_15a8);
      std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 63)\"=");
      stringify<unsigned_long>(&local_15c8,&local_1658);
      std::operator+(&local_15e8,&local_1608,&local_15c8);
      std::operator+(&local_1648,&local_15e8,")");
      loc.function = "run";
      loc.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc.line = 0xa2;
      msg._M_str = local_1648._M_dataplus._M_p;
      msg._M_len = local_1648._M_string_length;
      assertFail(msg,loc);
    }
  }
  stringify<unsigned_long>(&local_15a8,&local_1650);
  std::operator+(&local_1628,
                 "Comparison failed: ileaveZeros_const<15>(input) == detail::ileaveZeros_naive(input, 15) (with \"ileaveZeros_const<15>(input)\"="
                 ,&local_15a8);
  std::operator+(&local_1608,&local_1628,", \"detail::ileaveZeros_naive(input, 15)\"=");
  stringify<unsigned_long>(&local_15c8,&local_1658);
  std::operator+(&local_15e8,&local_1608,&local_15c8);
  std::operator+(&local_1648,&local_15e8,")");
  loc_01.function = "run";
  loc_01.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc_01.line = 0x9e;
  msg_01._M_str = local_1648._M_dataplus._M_p;
  msg_01._M_len = local_1648._M_string_length;
  assertFail(msg_01,loc_01);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveZeros_naive_matches_template)
{
    constexpr size_t iterations = 1024 * 8;

    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, std::numeric_limits<std::uint32_t>::max()};

    for (size_t i = 0; i < iterations; ++i) {
        const auto input = distr(rng);
        BITMANIP_ASSERT_EQ(ileaveZeros_const<1>(input), detail::ileaveZeros_naive(input, 1));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<2>(input), detail::ileaveZeros_naive(input, 2));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<3>(input), detail::ileaveZeros_naive(input, 3));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<4>(input), detail::ileaveZeros_naive(input, 4));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<5>(input), detail::ileaveZeros_naive(input, 5));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<6>(input), detail::ileaveZeros_naive(input, 6));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<7>(input), detail::ileaveZeros_naive(input, 7));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<8>(input), detail::ileaveZeros_naive(input, 8));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<9>(input), detail::ileaveZeros_naive(input, 9));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<10>(input), detail::ileaveZeros_naive(input, 10));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<11>(input), detail::ileaveZeros_naive(input, 11));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<12>(input), detail::ileaveZeros_naive(input, 12));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<13>(input), detail::ileaveZeros_naive(input, 13));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<14>(input), detail::ileaveZeros_naive(input, 14));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<15>(input), detail::ileaveZeros_naive(input, 15));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<16>(input), detail::ileaveZeros_naive(input, 16));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<16>(input), detail::ileaveZeros_naive(input, 16));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<32>(input), detail::ileaveZeros_naive(input, 32));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<63>(input), detail::ileaveZeros_naive(input, 63));
    }
}